

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::BitVector::setRange
          (BitVector *this,size_t offset,size_t count,bool value)

{
  reference ptr;
  int value_00;
  unsigned_long local_48;
  unsigned_long local_40;
  unsigned_long local_38;
  size_t endOfFullBlockNdx;
  size_t ndx;
  size_t sStack_20;
  bool value_local;
  size_t count_local;
  size_t offset_local;
  BitVector *this_local;
  
  ndx._7_1_ = value;
  sStack_20 = count;
  count_local = offset;
  offset_local = (size_t)this;
  for (endOfFullBlockNdx = offset;
      endOfFullBlockNdx < count_local + sStack_20 && (endOfFullBlockNdx & 0x1f) != 0;
      endOfFullBlockNdx = endOfFullBlockNdx + 1) {
    set(this,endOfFullBlockNdx,(bool)(ndx._7_1_ & 1));
  }
  local_40 = count_local + sStack_20;
  local_48 = 0x20;
  local_38 = roundDownToMultiple<unsigned_long>(&local_40,&local_48);
  if (endOfFullBlockNdx < local_38) {
    ptr = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                    (&this->m_data,endOfFullBlockNdx >> 5);
    value_00 = 0;
    if ((ndx._7_1_ & 1) != 0) {
      value_00 = 0xff;
    }
    ::deMemset(ptr,value_00,local_38 - endOfFullBlockNdx >> 3);
    endOfFullBlockNdx = local_38;
  }
  for (; endOfFullBlockNdx < count_local + sStack_20; endOfFullBlockNdx = endOfFullBlockNdx + 1) {
    set(this,endOfFullBlockNdx,(bool)(ndx._7_1_ & 1));
  }
  return;
}

Assistant:

void setRange (size_t offset, size_t count, bool value)
	{
		size_t ndx = offset;

		for (; (ndx < offset + count) && ((ndx % BLOCK_BIT_SIZE) != 0); ndx++)
		{
			DE_ASSERT(ndx >= offset);
			DE_ASSERT(ndx < offset + count);
			set(ndx, value);
		}

		{
			const size_t endOfFullBlockNdx = roundDownToMultiple<size_t>(offset + count, BLOCK_BIT_SIZE);

			if (ndx < endOfFullBlockNdx)
			{
				deMemset(&m_data[ndx / BLOCK_BIT_SIZE], (value ? 0xFF : 0x0), (endOfFullBlockNdx - ndx) / 8);
				ndx = endOfFullBlockNdx;
			}
		}

		for (; ndx < offset + count; ndx++)
		{
			DE_ASSERT(ndx >= offset);
			DE_ASSERT(ndx < offset + count);
			set(ndx, value);
		}
	}